

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O1

void pnga_print_distribution(int fstyle,Integer g_a)

{
  Integer IVar1;
  size_t sVar2;
  ulong uVar3;
  Integer *dims_00;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *in_R8;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  Integer ndim;
  Integer hi [7];
  Integer lo [7];
  Integer index [7];
  Integer nblocks [7];
  char *name;
  Integer type;
  char ctype [128];
  Integer proc_grid [7];
  Integer dims [7];
  char msg [100];
  Integer proc_idx [7];
  int local_310;
  undefined4 uStack_30c;
  int local_304;
  ulong local_300;
  ulong local_2f8;
  int local_2ec;
  Integer local_2e8 [8];
  Integer local_2a8 [6];
  long alStack_278 [8];
  long alStack_238 [2];
  Integer local_228 [8];
  char *local_1e8;
  Integer local_1e0;
  int local_1d8;
  undefined1 uStack_1d4;
  undefined1 uStack_1d3;
  undefined2 uStack_1d2;
  short local_1d0;
  undefined2 uStack_1ce;
  undefined1 uStack_1cc;
  long local_158 [6];
  Integer aIStack_128 [10];
  char local_d8 [112];
  Integer local_68 [7];
  
  local_304 = fstyle;
  local_300 = g_a;
  local_2f8 = pnga_nnodes();
  iVar4 = _ga_sync_end;
  bVar11 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  IVar1 = pnga_nodeid();
  uVar7 = local_300;
  if (IVar1 != 0) goto LAB_00124baa;
  dims_00 = aIStack_128 + 2;
  pnga_inquire(local_300,&local_1e0,(Integer *)&local_310,dims_00);
  pnga_inquire_name(uVar7,&local_1e8);
  printf("Array Handle=%d Name:\'%s\' ",uVar7 & 0xffffffff,local_1e8);
  printf("Data Type:");
  switch(local_1e0) {
  case 0x3e9:
    pcVar6 = "integer";
    break;
  case 0x3ea:
    pcVar6 = "long";
    break;
  case 0x3eb:
    pcVar6 = "float";
    break;
  case 0x3ec:
    pcVar6 = "double";
    break;
  default:
    pnga_error("ga_print_distribution: type not supported",local_1e0);
    goto LAB_00124398;
  case 0x3ee:
    pcVar6 = "float (single) complex";
    break;
  case 0x3ef:
    pcVar6 = "double complex";
    break;
  case 0x3f8:
    pcVar6 = "long long";
  }
  printf(pcVar6);
LAB_00124398:
  printf("\nArray Dimensions:");
  lVar10 = CONCAT44(uStack_30c,local_310);
  if (local_304 == 0) {
    if (1 < lVar10) {
      lVar10 = lVar10 + 1;
      do {
        printf("%ldx",aIStack_128[lVar10]);
        lVar10 = lVar10 + -1;
      } while (2 < lVar10);
    }
  }
  else {
    if (lVar10 < 2) {
      lVar10 = lVar10 + -1;
    }
    else {
      lVar8 = 0;
      do {
        printf("%ldx",aIStack_128[lVar8 + 2]);
        lVar8 = lVar8 + 1;
        lVar10 = CONCAT44(uStack_30c,local_310) + -1;
      } while (lVar8 < lVar10);
    }
    dims_00 = aIStack_128 + lVar10 + 2;
  }
  printf("%ld\n",*dims_00);
  pnga_get_distribution_type(local_300,(char *)&local_1d8);
  local_2ec = iVar4;
  if (CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) == 0x72616c75676572)
  {
    if (0 < (long)local_2f8) {
      uVar7 = 0;
      do {
        pnga_distribution(local_300,uVar7,local_2a8,local_2e8);
        sprintf(local_d8,"Process=%d\t owns array section: ",uVar7 & 0xffffffff);
        if (local_304 == 0) {
          lVar10 = CONCAT44(uStack_30c,local_310);
          if (1 < lVar10) {
            lVar5 = 0;
            lVar8 = lVar10;
            do {
              lVar8 = lVar8 + -1;
              IVar1 = local_2a8[lVar5];
              local_2a8[lVar5] = local_2a8[lVar8];
              local_2a8[lVar8] = IVar1;
              IVar1 = local_2e8[lVar5];
              in_R8 = (char *)local_2e8[lVar8];
              local_2e8[lVar5] = (Integer)in_R8;
              local_2e8[lVar8] = IVar1;
              lVar5 = lVar5 + 1;
            } while (lVar10 / 2 != lVar5);
          }
          if (0 < lVar10) {
            lVar8 = 0;
            do {
              local_2a8[lVar8] = local_2a8[lVar8] + -1;
              lVar8 = lVar8 + 1;
            } while (lVar10 != lVar8);
          }
          if (0 < lVar10) {
            lVar8 = 0;
            do {
              local_2e8[lVar8] = local_2e8[lVar8] + -1;
              lVar8 = lVar8 + 1;
            } while (lVar10 != lVar8);
          }
        }
        gai_print_range(local_d8,local_310,local_2a8,local_2e8,in_R8);
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_2f8);
    }
  }
  else if (CONCAT17(uStack_1cc,
                    CONCAT25(uStack_1ce,CONCAT23(local_1d0,CONCAT21(uStack_1d2,uStack_1d3)))) ==
           0x63696c6379635f &&
           CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
           0x79635f6b636f6c62) {
    pnga_nblock(local_300,local_228);
    puts("\nDistribution is block-cyclic");
    uVar7 = local_2f8;
    lVar10 = 1;
    if (0 < CONCAT44(uStack_30c,local_310)) {
      lVar8 = 0;
      do {
        lVar10 = lVar10 * local_228[lVar8];
        lVar8 = lVar8 + 1;
      } while (CONCAT44(uStack_30c,local_310) != lVar8);
    }
    printf("\nTotal of %ld blocks on %ld processors\n",lVar10,local_2f8);
    if (0 < (long)uVar7) {
      uVar7 = 0;
      do {
        printf("Distribution on process %ld\n",uVar7);
        uVar9 = uVar7;
        for (; (long)uVar7 < lVar10; uVar7 = uVar7 + local_2f8) {
          pnga_distribution(local_300,uVar7,local_2a8,local_2e8);
          sprintf(local_d8,"  Block=%d\t corresponds to array section: ",uVar7 & 0xffffffff);
          if (local_304 == 0) {
            uVar9 = CONCAT44(uStack_30c,local_310);
            if (1 < (long)uVar9) {
              lVar8 = 0;
              uVar3 = uVar9;
              do {
                uVar3 = uVar3 - 1;
                IVar1 = local_2a8[lVar8];
                local_2a8[lVar8] = local_2a8[uVar3];
                local_2a8[uVar3] = IVar1;
                IVar1 = local_2e8[lVar8];
                local_2e8[lVar8] = local_2e8[uVar3];
                local_2e8[uVar3] = IVar1;
                lVar8 = lVar8 + 1;
              } while ((long)uVar9 / 2 != lVar8);
            }
            if (0 < (long)uVar9) {
              uVar3 = 0;
              do {
                local_2a8[uVar3] = local_2a8[uVar3] + -1;
                uVar3 = uVar3 + 1;
              } while (uVar9 != uVar3);
            }
            if ((long)uVar9 < 1) {
              uVar9 = 0;
            }
            else {
              uVar3 = 0;
              do {
                local_2e8[uVar3] = local_2e8[uVar3] + -1;
                uVar3 = uVar3 + 1;
              } while (uVar9 != uVar3);
            }
          }
          gai_print_range(local_d8,local_310,local_2a8,local_2e8,in_R8);
        }
        uVar7 = uVar9 + 1;
      } while ((long)uVar7 < (long)local_2f8);
    }
  }
  else if (((local_1d0 == 0x6b &&
             CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
             0x636170616c616373) ||
           (CONCAT22(uStack_1ce,local_1d0) == 0x676572 &&
            CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
            0x72695f64656c6974)) ||
          (CONCAT11(uStack_1d3,uStack_1d4) == 100 && local_1d8 == 0x656c6974)) {
    pnga_nblock(local_300,local_228);
    if (local_1d0 == 0x6b &&
        CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
        0x636170616c616373) {
      pcVar6 = "\nDistribution is ScaLAPACK";
LAB_001247f7:
      puts(pcVar6);
    }
    else {
      if (CONCAT22(uStack_1ce,local_1d0) == 0x676572 &&
          CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
          0x72695f64656c6974) {
        pcVar6 = "\nDistribution is Tiled Irregular";
        goto LAB_001247f7;
      }
      if (CONCAT11(uStack_1d3,uStack_1d4) == 100 && local_1d8 == 0x656c6974) {
        pcVar6 = "\nDistribution is Tiled";
        goto LAB_001247f7;
      }
    }
    putchar(10);
    printf("Number of blocks in each dimension: [");
    if (CONCAT44(uStack_30c,local_310) < 2) {
      lVar10 = CONCAT44(uStack_30c,local_310) + -1;
    }
    else {
      lVar8 = 0;
      do {
        printf("%ld,",local_228[lVar8]);
        lVar8 = lVar8 + 1;
        lVar10 = CONCAT44(uStack_30c,local_310) + -1;
      } while (lVar8 < lVar10);
    }
    printf("%ld]\n\n",local_228[lVar10]);
    pnga_get_proc_grid(local_300,local_158);
    printf("Processor grid dimensions: [");
    if (CONCAT44(uStack_30c,local_310) < 2) {
      lVar10 = CONCAT44(uStack_30c,local_310) + -1;
    }
    else {
      lVar8 = 0;
      do {
        printf("%ld,",local_158[lVar8]);
        lVar8 = lVar8 + 1;
        lVar10 = CONCAT44(uStack_30c,local_310) + -1;
      } while (lVar8 < lVar10);
    }
    printf("%ld]\n\n",local_228[lVar10]);
    if (0 < (long)local_2f8) {
      lVar10 = 0;
      do {
        printf("Distribution on process %ld\n",lVar10);
        uVar7 = local_300;
        pnga_get_proc_index(local_300,lVar10,local_68);
        pnga_get_proc_index(uVar7,lVar10,alStack_278 + 2);
        do {
          if (CONCAT44(uStack_30c,local_310) < 1) {
            IVar1 = 0;
          }
          else {
            lVar8 = CONCAT44(uStack_30c,local_310) + 1;
            IVar1 = 0;
            do {
              IVar1 = IVar1 * alStack_238[lVar8] + alStack_278[lVar8];
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
          sprintf(local_d8," idx: %ld Block=[",IVar1);
          pnga_distribution(local_300,IVar1,local_2a8,local_2e8);
          sVar2 = strlen(local_d8);
          lVar8 = CONCAT44(uStack_30c,local_310);
          uVar7 = lVar8 - 1;
          pcVar6 = local_d8 + sVar2;
          if (local_304 == 0) {
            lVar5 = alStack_278[2];
            uVar9 = uVar7;
            if (1 < lVar8) {
              do {
                sprintf(pcVar6,"%ld,",alStack_278[uVar9 + 2]);
                sVar2 = strlen(pcVar6);
                pcVar6 = pcVar6 + sVar2;
                uVar9 = uVar9 + 1;
                lVar5 = alStack_278[2];
              } while (-1 < (long)uVar7);
            }
          }
          else {
            uVar9 = 0;
            if (1 < lVar8) {
              do {
                sprintf(pcVar6,"%ld,",alStack_278[uVar9 + 2]);
                sVar2 = strlen(pcVar6);
                pcVar6 = pcVar6 + sVar2;
                uVar9 = uVar9 + 1;
                uVar7 = CONCAT44(uStack_30c,local_310) - 1;
              } while ((long)uVar9 < (long)uVar7);
            }
            lVar5 = alStack_278[uVar7 + 2];
          }
          sprintf(pcVar6,"%ld]",lVar5);
          sVar2 = strlen(pcVar6);
          sprintf(pcVar6 + sVar2,"\t corresponds to array section: %d ",uVar9 & 0xffffffff);
          if (local_304 == 0) {
            lVar10 = CONCAT44(uStack_30c,local_310);
            if (1 < lVar10) {
              lVar5 = 0;
              lVar8 = lVar10;
              do {
                lVar8 = lVar8 + -1;
                IVar1 = local_2a8[lVar5];
                local_2a8[lVar5] = local_2a8[lVar8];
                local_2a8[lVar8] = IVar1;
                IVar1 = local_2e8[lVar5];
                local_2e8[lVar5] = local_2e8[lVar8];
                local_2e8[lVar8] = IVar1;
                lVar5 = lVar5 + 1;
              } while (lVar10 / 2 != lVar5);
            }
            if (0 < lVar10) {
              lVar8 = 0;
              do {
                local_2a8[lVar8] = local_2a8[lVar8] + -1;
                lVar8 = lVar8 + 1;
              } while (lVar10 != lVar8);
            }
            if (lVar10 < 1) {
              lVar10 = 0;
            }
            else {
              lVar8 = 0;
              do {
                local_2e8[lVar8] = local_2e8[lVar8] + -1;
                lVar8 = lVar8 + 1;
              } while (lVar10 != lVar8);
            }
          }
          gai_print_range(local_d8,local_310,local_2a8,local_2e8,in_R8);
          alStack_278[2] = alStack_278[2] + local_158[0];
          lVar8 = CONCAT44(uStack_30c,local_310);
          if (0 < lVar8) {
            lVar5 = 0;
            do {
              if (lVar5 < lVar8 + -1 && local_228[lVar5] <= alStack_278[lVar5 + 2]) {
                alStack_278[lVar5 + 2] = local_68[lVar5];
                alStack_278[lVar5 + 3] = alStack_278[lVar5 + 3] + local_158[lVar5 + 1];
              }
              lVar5 = lVar5 + 1;
            } while (lVar8 != lVar5);
          }
        } while (alStack_278[lVar8 + 1] < local_228[lVar8 + -1]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (long)local_2f8);
    }
  }
  else {
    puts("\nData distribution type is unknown");
  }
  fflush(_stdout);
  iVar4 = local_2ec;
LAB_00124baa:
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_print_distribution(int fstyle, Integer g_a)
{
Integer ndim, i, proc, type, nproc=pnga_nnodes();
Integer dims[MAXDIM], lo[MAXDIM], hi[MAXDIM];
char msg[100];
char ctype[128];
char *name;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(pnga_nodeid() ==0){
      pnga_inquire(g_a, &type, &ndim, dims);
      pnga_inquire_name(g_a, &name);
      printf("Array Handle=%d Name:'%s' ",(int)g_a, name);
      printf("Data Type:");
      switch(type){
        case C_DBL: printf("double"); break;
        case C_INT: printf("integer"); break;
        case C_DCPL: printf("double complex"); break;
        case C_SCPL: printf("float (single) complex"); break;
        case C_FLOAT: printf("float"); break; 
        case C_LONG: printf("long"); break; 
        case C_LONGLONG: printf("long long"); break; 
        default: pnga_error("ga_print_distribution: type not supported",type);
      }
      printf("\nArray Dimensions:");
      if(fstyle){
         for(i=0; i<ndim-1; i++)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[ndim-1]);
      }else{
         for(i=ndim-1; i>0; i--)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[0]);
      }

      /* print array range for every processor */
      
      pnga_get_distribution_type(g_a, ctype);
      if (!strcmp(ctype,"regular")) {
        for(proc = 0; proc < nproc; proc++){
          pnga_distribution(g_a,proc,lo,hi);
          sprintf(msg,"Process=%d\t owns array section: ",(int)proc);

          /* for C style need to swap and decremenent by 1 both arrays */
          if(!fstyle){
            for(i=0; i<ndim/2; i++){
              swap(lo+i,lo+ndim-i-1); 
              swap(hi+i,hi+ndim-i-1); 
            }
            for(i=0; i<ndim; i++)lo[i]--;
            for(i=0; i<ndim; i++)hi[i]--;
          }
          gai_print_range(msg,(int)ndim,lo,hi,"\n");
        }
      } else if (!strcmp(ctype,"block_cyclic")) {
        Integer nblocks[MAXDIM];
        Integer total, j;
        pnga_nblock(g_a,nblocks);
        printf("\nDistribution is block-cyclic\n");
        total = 1;
        for (i=0; i<ndim; i++) {
          total *= nblocks[i];
        }
        printf("\nTotal of %ld blocks on %ld processors\n",total,nproc);
        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          for (j=i; j<total; j += nproc) {
            pnga_distribution(g_a,j,lo,hi);
            sprintf(msg,"  Block=%d\t corresponds to array section: ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
          }
        }
      } else if (!strcmp(ctype,"scalapack") ||
          !strcmp(ctype,"tiled_irreg") || !strcmp(ctype,"tiled")) {
        Integer nblocks[MAXDIM], proc_grid[MAXDIM], proc_idx[MAXDIM];
        Integer index[MAXDIM];
        Integer ok, j, idx;
        pnga_nblock(g_a,nblocks);
        char *ptr;
        if (!strcmp(ctype,"scalapack")) {
          printf("\nDistribution is ScaLAPACK\n");
        } else if (!strcmp(ctype,"tiled_irreg")) {
          printf("\nDistribution is Tiled Irregular\n");
        } else if (!strcmp(ctype,"tiled")) {
          printf("\nDistribution is Tiled\n");
        }

        printf("\n");
        printf("Number of blocks in each dimension: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",nblocks[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        pnga_get_proc_grid(g_a,proc_grid);
        printf("Processor grid dimensions: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",proc_grid[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          pnga_get_proc_index(g_a,i,proc_idx);
          pnga_get_proc_index(g_a,i,index);
          ok = 1;
          while (ok) {
            /* find block index */
            idx = 0;
            for (j=ndim-1; j>=0; j--) {
              idx = idx*nblocks[j]+index[j];
            }
            sprintf(msg," idx: %ld Block=[",idx);
            pnga_distribution(g_a,idx,lo,hi);
            ptr = msg + strlen(msg);
            if (fstyle) {
              for (j=0; j<ndim-1; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[ndim-1]);
              ptr += strlen(ptr);
            } else {
              for (j=ndim-1; j>0; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[0]);
              ptr += strlen(ptr);
            }
            sprintf(ptr,"\t corresponds to array section: %d ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
            index[0] += proc_grid[0];
            for (j=0; j<ndim; j++) {
              if (index[j] >= nblocks[j] && j<ndim-1) {
                index[j] = proc_idx[j];
                index[j+1] += proc_grid[j+1];
              }
            }
            if (index[ndim-1] >= nblocks[ndim-1]) ok = 0;
          }
        }
      } else {
        printf("\nData distribution type is unknown\n");
      }
      fflush(stdout);
    }

    if(local_sync_end)pnga_sync();
}